

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

_Bool http2_connisdead(Curl_easy *data,connectdata *conn)

{
  connectdata *pcVar1;
  _Bool _Var2;
  int iVar3;
  anon_union_248_5_a113b5f6_for_proto *httpc_00;
  size_t local_40;
  ssize_t nread;
  http_conn *httpc;
  byte local_25;
  CURLcode result;
  _Bool dead;
  connectdata *pcStack_20;
  int sval;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_25 = 1;
  if ((*(uint *)&(conn->bits).field_0x4 >> 6 & 1) == 0) {
    pcStack_20 = conn;
    conn_local = (connectdata *)data;
    result = Curl_socket_check(conn->sock[0],-1,-1,0);
    if (result == CURLE_OK) {
      local_25 = 0;
    }
    else if ((result & CURLE_NOT_BUILT_IN) == CURLE_OK) {
      if ((result & CURLE_UNSUPPORTED_PROTOCOL) != CURLE_OK) {
        _Var2 = Curl_connalive(pcStack_20);
        pcVar1 = pcStack_20;
        local_25 = (_Var2 ^ 0xffU) & 1;
        if (local_25 == 0) {
          httpc_00 = &pcStack_20->proto;
          local_40 = 0xffffffffffffffff;
          if ((pcStack_20->proto).ftpc.pp.sendbuf.toobig != 0) {
            local_40 = (*(pcStack_20->proto).httpc.recv_underlying)
                                 ((Curl_easy *)conn_local,0,
                                  (char *)(pcStack_20->proto).ftpc.pp.statemachine,0x8000,
                                  (CURLcode *)((long)&httpc + 4));
          }
          if (local_40 == 0xffffffffffffffff) {
            local_25 = 1;
          }
          else {
            (pcVar1->proto).ftpc.entrypath = (char *)0x0;
            (pcVar1->proto).httpc.inbuflen = local_40;
            iVar3 = h2_process_pending_input
                              ((Curl_easy *)conn_local,&httpc_00->httpc,
                               (CURLcode *)((long)&httpc + 4));
            if (iVar3 < 0) {
              local_25 = 1;
            }
          }
        }
      }
    }
    else {
      local_25 = 1;
    }
    data_local._7_1_ = (_Bool)(local_25 & 1);
  }
  else {
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

static bool http2_connisdead(struct Curl_easy *data, struct connectdata *conn)
{
  int sval;
  bool dead = TRUE;

  if(conn->bits.close)
    return TRUE;

  sval = SOCKET_READABLE(conn->sock[FIRSTSOCKET], 0);
  if(sval == 0) {
    /* timeout */
    dead = FALSE;
  }
  else if(sval & CURL_CSELECT_ERR) {
    /* socket is in an error state */
    dead = TRUE;
  }
  else if(sval & CURL_CSELECT_IN) {
    /* readable with no error. could still be closed */
    dead = !Curl_connalive(conn);
    if(!dead) {
      /* This happens before we've sent off a request and the connection is
         not in use by any other transfer, there shouldn't be any data here,
         only "protocol frames" */
      CURLcode result;
      struct http_conn *httpc = &conn->proto.httpc;
      ssize_t nread = -1;
      if(httpc->recv_underlying)
        /* if called "too early", this pointer isn't setup yet! */
        nread = ((Curl_recv *)httpc->recv_underlying)(
          data, FIRSTSOCKET, httpc->inbuf, H2_BUFSIZE, &result);
      if(nread != -1) {
        H2BUGF(infof(data,
                     "%d bytes stray data read before trying h2 connection",
                     (int)nread));
        httpc->nread_inbuf = 0;
        httpc->inbuflen = nread;
        if(h2_process_pending_input(data, httpc, &result) < 0)
          /* immediate error, considered dead */
          dead = TRUE;
      }
      else
        /* the read failed so let's say this is dead anyway */
        dead = TRUE;
    }
  }

  return dead;
}